

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void update_rhythm_mode(EOPLL *opll)

{
  uint32_t *puVar1;
  byte bVar2;
  
  bVar2 = opll->reg[0xe] >> 5 & 1;
  if (opll->rhythm_mode != bVar2) {
    if (bVar2 == 0) {
      opll->slot[0xe].type = '\0';
      opll->slot[0xe].pg_keep = '\0';
      opll->slot[0xf].type = '\x01';
      opll->slot[0x10].type = '\0';
      opll->slot[0x11].type = '\x01';
      opll->slot[0x11].pg_keep = '\0';
      set_patch(opll,6,(uint)(opll->reg[0x36] >> 4));
      set_patch(opll,7,(uint)(opll->reg[0x37] >> 4));
      set_patch(opll,8,(uint)(opll->reg[0x38] >> 4));
    }
    else {
      opll->slot[0xe].type = '\x03';
      opll->slot[0xe].pg_keep = '\x01';
      opll->slot[0xf].type = '\x03';
      opll->slot[0x10].type = '\x03';
      opll->slot[0x11].type = '\x03';
      opll->slot[0x11].pg_keep = '\x01';
      opll->patch_number[6] = 0x10;
      opll->slot[0xc].patch = opll->patch + 0x20;
      opll->slot[0xd].patch = opll->patch + 0x21;
      *(undefined1 *)&opll->slot[0xc].update_requests = 0xff;
      *(undefined1 *)&opll->slot[0xd].update_requests = 0xff;
      opll->patch_number[7] = 0x11;
      opll->patch_number[8] = 0x12;
      opll->slot[0xe].patch = opll->patch + 0x22;
      opll->slot[0xf].patch = opll->patch + 0x23;
      *(undefined1 *)&opll->slot[0xf].update_requests = 0xff;
      opll->slot[0x10].patch = opll->patch + 0x24;
      opll->slot[0x11].patch = opll->patch + 0x25;
      puVar1 = &opll->slot[0xe].update_requests;
      *puVar1 = *puVar1 | 0xff;
      *(undefined1 *)&opll->slot[0x11].update_requests = 0xff;
      opll->slot[0xe].volume = opll->reg[0x37] >> 2 & 0x3c;
      opll->slot[0x10].volume = *(uint *)(opll->reg + 0x38) >> 2 & 0x3c;
      *(undefined1 *)&opll->slot[0x10].update_requests = 0xff;
    }
  }
  opll->rhythm_mode = bVar2;
  return;
}

Assistant:

static INLINE void update_rhythm_mode(EOPLL *opll) {
  const uint8_t new_rhythm_mode = (opll->reg[0x0e] >> 5) & 1;

  if (opll->rhythm_mode != new_rhythm_mode) {

    if (new_rhythm_mode) {
      opll->slot[SLOT_HH].type = 3;
      opll->slot[SLOT_HH].pg_keep = 1;
      opll->slot[SLOT_SD].type = 3;
      opll->slot[SLOT_TOM].type = 3;
      opll->slot[SLOT_CYM].type = 3;
      opll->slot[SLOT_CYM].pg_keep = 1;
      set_patch(opll, 6, 16);
      set_patch(opll, 7, 17);
      set_patch(opll, 8, 18);
      set_slot_volume(&opll->slot[SLOT_HH], ((opll->reg[0x37] >> 4) & 15) << 2);
      set_slot_volume(&opll->slot[SLOT_TOM], ((opll->reg[0x38] >> 4) & 15) << 2);
    } else {
      opll->slot[SLOT_HH].type = 0;
      opll->slot[SLOT_HH].pg_keep = 0;
      opll->slot[SLOT_SD].type = 1;
      opll->slot[SLOT_TOM].type = 0;
      opll->slot[SLOT_CYM].type = 1;
      opll->slot[SLOT_CYM].pg_keep = 0;
      set_patch(opll, 6, opll->reg[0x36] >> 4);
      set_patch(opll, 7, opll->reg[0x37] >> 4);
      set_patch(opll, 8, opll->reg[0x38] >> 4);
    }
  }

  opll->rhythm_mode = new_rhythm_mode;
}